

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void cmTargetCheckLINK_INTERFACE_LIBRARIES
               (string *prop,char *value,cmMakefile *context,bool imported)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  if (cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
      ::keys == '\0') {
    iVar3 = __cxa_guard_acquire(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                                 ::keys);
    if (iVar3 != 0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES::keys.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,"(^|;)(debug|optimized|general)(;|$)")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,&__dso_handle);
      __cxa_guard_release(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                           ::keys);
    }
  }
  bVar2 = cmsys::RegularExpression::find(&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,value);
  if (bVar2) {
    pcVar6 = "LINK_INTERFACE_LIBRARIES";
    if (imported) {
      pcVar6 = "IMPORTED_LINK_INTERFACE_LIBRARIES";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Property ",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," may not contain link-type keyword \"",0x24);
    paVar1 = &local_1c8.field_2;
    local_1c8._M_dataplus._M_p = (pointer)paVar1;
    if (cmTargetCheckLINK_INTERFACE_LIBRARIES::keys.startp[2] == (char *)0x0) {
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,cmTargetCheckLINK_INTERFACE_LIBRARIES::keys.startp[2],
                 cmTargetCheckLINK_INTERFACE_LIBRARIES::keys.endp[2]);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".  ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"The ",4);
    lVar5 = (ulong)imported * 9 + 0x18;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," property has a per-configuration ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"version called ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_<CONFIG> which may be ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"used to specify per-configuration rules.",0x28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if (!imported) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Alternatively, an IMPORTED library may be created, configured ",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"with a per-configuration location, and then named in the ",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"property value.  ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"See the add_library command\'s IMPORTED mode for details.",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"If you have a list of libraries that already contains the ",
                 0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"keyword, use the target_link_libraries command with its ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"LINK_INTERFACE_LIBRARIES mode to set the property.  ",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The command automatically recognizes link-type keywords and sets ",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG ",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"properties accordingly.",0x17);
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

static void cmTargetCheckLINK_INTERFACE_LIBRARIES(
  const std::string& prop, const char* value, cmMakefile* context,
  bool imported)
{
  // Look for link-type keywords in the value.
  static cmsys::RegularExpression
    keys("(^|;)(debug|optimized|general)(;|$)");
  if(!keys.find(value))
    {
    return;
    }

  // Support imported and non-imported versions of the property.
  const char* base = (imported?
                      "IMPORTED_LINK_INTERFACE_LIBRARIES" :
                      "LINK_INTERFACE_LIBRARIES");

  // Report an error.
  std::ostringstream e;
  e << "Property " << prop << " may not contain link-type keyword \""
    << keys.match(2) << "\".  "
    << "The " << base << " property has a per-configuration "
    << "version called " << base << "_<CONFIG> which may be "
    << "used to specify per-configuration rules.";
  if(!imported)
    {
    e << "  "
      << "Alternatively, an IMPORTED library may be created, configured "
      << "with a per-configuration location, and then named in the "
      << "property value.  "
      << "See the add_library command's IMPORTED mode for details."
      << "\n"
      << "If you have a list of libraries that already contains the "
      << "keyword, use the target_link_libraries command with its "
      << "LINK_INTERFACE_LIBRARIES mode to set the property.  "
      << "The command automatically recognizes link-type keywords and sets "
      << "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG "
      << "properties accordingly.";
    }
  context->IssueMessage(cmake::FATAL_ERROR, e.str());
}